

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::PrimitiveObjFieldGenerator::~PrimitiveObjFieldGenerator
          (PrimitiveObjFieldGenerator *this)

{
  (this->super_ObjCObjFieldGenerator).super_SingleFieldGenerator.super_FieldGenerator.
  _vptr_FieldGenerator = (_func_int **)&PTR__SingleFieldGenerator_004e0370;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->super_ObjCObjFieldGenerator).super_SingleFieldGenerator.super_FieldGenerator.
               variables_._M_t);
  return;
}

Assistant:

RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : RepeatedFieldGenerator(descriptor, options) {
  SetPrimitiveVariables(descriptor, &variables_);

  std::string base_name = PrimitiveArrayTypeName(descriptor);
  if (base_name.length()) {
    variables_["array_storage_type"] = "GPB" + base_name + "Array";
  } else {
    variables_["array_storage_type"] = "NSMutableArray";
    variables_["array_property_type"] =
        "NSMutableArray<" + variables_["storage_type"] + "*>";
  }
}